

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O2

void __thiscall QPainter::drawPie(QPainter *this,QRectF *r,int a,int alen)

{
  double dVar1;
  uint uVar2;
  long in_FS_OFFSET;
  QPainterPath path;
  QPointF local_78;
  QPainterPath local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  char *pcStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>)
      *(tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor> *)
       &(((this->d_ptr)._M_t.
          super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
          super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
          super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl)->engine)._M_t ==
      (__uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>)0x0) {
    local_58 = 2;
    uStack_44 = 0;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    local_48 = 0;
    pcStack_40 = "default";
    QMessageLogger::warning((char *)&local_58,"QPainter::drawPie: Painter not active");
  }
  else {
    if (a < 0x1681) {
      if ((a < 0) && (uVar2 = -a, a = 0x1680 - uVar2 % 0x1680, uVar2 % 0x1680 == 0)) {
        a = 0;
      }
    }
    else {
      a = (uint)a % 0x1680;
    }
    local_48 = 0xffffffff;
    uStack_44 = 0xffffffff;
    pcStack_40 = (char *)0xffffffffffffffff;
    local_58 = 0xffffffff;
    uStack_54 = 0xffffffff;
    uStack_50 = 0xffffffff;
    uStack_4c = 0xffffffff;
    QRectF::normalized();
    local_60.d_ptr.d.ptr = (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath(&local_60);
    dVar1 = (double)pcStack_40 * 0.5 + (double)CONCAT44(uStack_4c,uStack_50);
    local_78.yp._0_4_ = SUB84(dVar1,0);
    local_78.xp = (double)CONCAT44(uStack_44,local_48) * 0.5 + (double)CONCAT44(uStack_54,local_58);
    local_78.yp._4_4_ = (int)((ulong)dVar1 >> 0x20);
    QPainterPath::moveTo(&local_60,&local_78);
    QPainterPath::arcTo(&local_60,(qreal)CONCAT44(uStack_54,local_58),
                        (qreal)CONCAT44(uStack_4c,uStack_50),(qreal)CONCAT44(uStack_44,local_48),
                        (qreal)pcStack_40,(double)a * 0.0625,(double)alen * 0.0625);
    QPainterPath::closeSubpath(&local_60);
    drawPath(this,&local_60);
    QPainterPath::~QPainterPath(&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPainter::drawPie(const QRectF &r, int a, int alen)
{
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::drawPie(), [%.2f,%.2f,%.2f,%.2f], angle=%d, sweep=%d\n",
           r.x(), r.y(), r.width(), r.height(), a/16, alen/16);
#endif
    Q_D(QPainter);

    if (!d->engine) {
        qWarning("QPainter::drawPie: Painter not active");
        return;
    }

    if (a > (360*16)) {
        a = a % (360*16);
    } else if (a < 0) {
        a = a % (360*16);
        if (a < 0) a += (360*16);
    }

    QRectF rect = r.normalized();

    QPainterPath path;
    path.moveTo(rect.center());
    path.arcTo(rect.x(), rect.y(), rect.width(), rect.height(), a/16.0, alen/16.0);
    path.closeSubpath();
    drawPath(path);

}